

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.h
# Opt level: O2

void __thiscall CBlockHeader::SetNull(CBlockHeader *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->nVersion = 0;
  base_blob<256U>::SetNull(&(this->hashPrevBlock).super_base_blob<256U>);
  base_blob<256U>::SetNull(&(this->hashMerkleRoot).super_base_blob<256U>);
  this->nTime = 0;
  this->nBits = 0;
  this->nNonce = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetNull()
    {
        nVersion = 0;
        hashPrevBlock.SetNull();
        hashMerkleRoot.SetNull();
        nTime = 0;
        nBits = 0;
        nNonce = 0;
    }